

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb__arith_putbyte(stb_arith *a,int byte)

{
  int local_18;
  int i;
  int byte_local;
  stb_arith *a_local;
  
  if (a->pending_ffs == 0) {
    if (byte == 0xff) {
      a->pending_ffs = a->pending_ffs + 1;
    }
    else {
      stb_putc(a->output,a->buffered_u8);
      a->buffered_u8 = byte;
    }
  }
  else if (a->pending_ffs == -1) {
    if (byte == 0xff) {
      stb_putc(a->output,0xff);
    }
    else {
      a->buffered_u8 = byte;
      a->pending_ffs = 0;
    }
  }
  else if (byte == 0xff) {
    a->pending_ffs = a->pending_ffs + 1;
  }
  else {
    stb_putc(a->output,a->buffered_u8);
    for (local_18 = 0; local_18 < a->pending_ffs; local_18 = local_18 + 1) {
      stb_putc(a->output,0xff);
    }
  }
  return;
}

Assistant:

static void stb__arith_putbyte(stb_arith *a, int byte)
{
   if (a->pending_ffs) {
      if (a->pending_ffs == -1) { // means no buffered data; encoded for fast path efficiency
         if (byte == 0xff)
            stb_putc(a->output, byte); // just write it immediately
         else {
            a->buffered_u8 = byte;
            a->pending_ffs = 0;
         }
      } else if (byte == 0xff) {
         ++a->pending_ffs;
      } else {
         int i;
         stb_putc(a->output, a->buffered_u8);
         for (i=0; i < a->pending_ffs; ++i)
            stb_putc(a->output, 0xff);
      }
   } else if (byte == 0xff) {
      ++a->pending_ffs;
   } else {
      // fast path
      stb_putc(a->output, a->buffered_u8);
      a->buffered_u8 = byte;
   }
}